

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcGetSceneLinearBounds(RTCScene hscene,RTCLinearBounds *bounds_o)

{
  undefined8 *puVar1;
  DeviceEnterLeave enterleave;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  DeviceEnterLeave local_38;
  
  if (hscene == (RTCScene)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"invalid argument","");
    *puVar1 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_58,local_58 + local_50);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  embree::DeviceEnterLeave::DeviceEnterLeave(&local_38,hscene);
  if (bounds_o != (RTCLinearBounds *)0x0) {
    if (hscene[0x250] != (RTCSceneTy)0x1) {
      (bounds_o->bounds0).lower_x = *(float *)(hscene + 0x10);
      (bounds_o->bounds0).lower_y = *(float *)(hscene + 0x14);
      (bounds_o->bounds0).lower_z = *(float *)(hscene + 0x18);
      (bounds_o->bounds0).align0 = 0.0;
      (bounds_o->bounds0).upper_x = *(float *)(hscene + 0x20);
      (bounds_o->bounds0).upper_y = *(float *)(hscene + 0x24);
      (bounds_o->bounds0).upper_z = *(float *)(hscene + 0x28);
      (bounds_o->bounds0).align1 = 0.0;
      (bounds_o->bounds1).lower_x = *(float *)(hscene + 0x30);
      (bounds_o->bounds1).lower_y = *(float *)(hscene + 0x34);
      (bounds_o->bounds1).lower_z = *(float *)(hscene + 0x38);
      (bounds_o->bounds1).align0 = 0.0;
      (bounds_o->bounds1).upper_x = *(float *)(hscene + 0x40);
      (bounds_o->bounds1).upper_y = *(float *)(hscene + 0x44);
      (bounds_o->bounds1).upper_z = *(float *)(hscene + 0x48);
      (bounds_o->bounds1).align1 = 0.0;
      embree::DeviceEnterLeave::~DeviceEnterLeave(&local_38);
      return;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"scene not committed","");
    *puVar1 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar1 + 1) = 3;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_58,local_58 + local_50);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"invalid destination pointer","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_58,local_58 + local_50);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcGetSceneLinearBounds(RTCScene hscene, RTCLinearBounds* bounds_o)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetSceneBounds);
    RTC_VERIFY_HANDLE(hscene);
    RTC_ENTER_DEVICE(hscene);
    if (bounds_o == nullptr)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid destination pointer");
    if (scene->isModified())
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    
    bounds_o->bounds0.lower_x = scene->bounds.bounds0.lower.x;
    bounds_o->bounds0.lower_y = scene->bounds.bounds0.lower.y;
    bounds_o->bounds0.lower_z = scene->bounds.bounds0.lower.z;
    bounds_o->bounds0.align0  = 0;
    bounds_o->bounds0.upper_x = scene->bounds.bounds0.upper.x;
    bounds_o->bounds0.upper_y = scene->bounds.bounds0.upper.y;
    bounds_o->bounds0.upper_z = scene->bounds.bounds0.upper.z;
    bounds_o->bounds0.align1  = 0;
    bounds_o->bounds1.lower_x = scene->bounds.bounds1.lower.x;
    bounds_o->bounds1.lower_y = scene->bounds.bounds1.lower.y;
    bounds_o->bounds1.lower_z = scene->bounds.bounds1.lower.z;
    bounds_o->bounds1.align0  = 0;
    bounds_o->bounds1.upper_x = scene->bounds.bounds1.upper.x;
    bounds_o->bounds1.upper_y = scene->bounds.bounds1.upper.y;
    bounds_o->bounds1.upper_z = scene->bounds.bounds1.upper.z;
    bounds_o->bounds1.align1  = 0;
    RTC_CATCH_END2(scene);
  }